

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageTexture.cpp
# Opt level: O0

int __thiscall vkt::image::Texture::dimension(Texture *this)

{
  ImageType IVar1;
  Texture *this_local;
  
  IVar1 = this->m_type;
  if (IVar1 != IMAGE_TYPE_1D) {
    if (IVar1 - IMAGE_TYPE_1D_ARRAY < 2) {
      return 2;
    }
    if (IVar1 - IMAGE_TYPE_2D_ARRAY < 4) {
      return 3;
    }
    if (IVar1 != IMAGE_TYPE_BUFFER) {
      return 0;
    }
  }
  return 1;
}

Assistant:

int Texture::dimension (void) const
{
	switch (m_type)
	{
		case IMAGE_TYPE_1D:
		case IMAGE_TYPE_BUFFER:
			return 1;

		case IMAGE_TYPE_1D_ARRAY:
		case IMAGE_TYPE_2D:
			return 2;

		case IMAGE_TYPE_2D_ARRAY:
		case IMAGE_TYPE_CUBE:
		case IMAGE_TYPE_CUBE_ARRAY:
		case IMAGE_TYPE_3D:
			return 3;

		default:
			DE_FATAL("Internal error");
			return 0;
	}
}